

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

size_t center_NAs(size_t *ix_arr,size_t st_left,size_t st,size_t curr_pos)

{
  size_t sVar1;
  size_t sVar2;
  
  if (st_left < st) {
    do {
      sVar1 = curr_pos - 1;
      sVar2 = ix_arr[curr_pos - 1];
      ix_arr[curr_pos - 1] = ix_arr[st_left];
      ix_arr[st_left] = sVar2;
      st_left = st_left + 1;
      curr_pos = sVar1;
    } while (st != st_left);
    return sVar1;
  }
  return curr_pos;
}

Assistant:

size_t center_NAs(size_t ix_arr[], size_t st_left, size_t st, size_t curr_pos)
{
    size_t temp;
    for (size_t row = st_left; row < st; row++)
    {
        temp = ix_arr[--curr_pos];
        ix_arr[curr_pos] = ix_arr[row];
        ix_arr[row] = temp;
    }

    return curr_pos;
}